

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O3

Byte ppmd_read(void *p)

{
  Byte BVar1;
  archive_read *a;
  void *pvVar2;
  Byte *pBVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  ssize_t bytes_avail;
  ssize_t local_20;
  
  a = *p;
  pvVar2 = a->format->data;
  lVar5 = *(long *)((long)pvVar2 + 0x4de0);
  if (lVar5 < 1) {
    local_20 = 0;
    pvVar4 = __archive_read_ahead(a,*(long *)((long)pvVar2 + 0x4df0) + 1,&local_20);
    lVar6 = *(long *)((long)pvVar2 + 0x4df0);
    if (local_20 <= lVar6) {
      archive_set_error(&a->archive,0x54,"Truncated 7z file data");
      *(undefined4 *)((long)pvVar2 + 0x4e10) = 1;
      return '\0';
    }
    *(long *)((long)pvVar2 + 0x4dd8) = *(long *)((long)pvVar2 + 0x4dd8) + 1;
    BVar1 = *(Byte *)((long)pvVar4 + lVar6);
    lVar5 = *(long *)((long)pvVar2 + 0x4de0);
  }
  else {
    pBVar3 = *(Byte **)((long)pvVar2 + 0x4dd8);
    lVar6 = *(long *)((long)pvVar2 + 0x4df0);
    *(Byte **)((long)pvVar2 + 0x4dd8) = pBVar3 + 1;
    BVar1 = *pBVar3;
  }
  *(long *)((long)pvVar2 + 0x4de0) = lVar5 + -1;
  *(long *)((long)pvVar2 + 0x4de8) = *(long *)((long)pvVar2 + 0x4de8) + 1;
  *(long *)((long)pvVar2 + 0x4df0) = lVar6 + 1;
  return BVar1;
}

Assistant:

static Byte
ppmd_read(void *p)
{
	struct archive_read *a = ((IByteIn*)p)->a;
	struct _7zip *zip = (struct _7zip *)(a->format->data);
	Byte b;

	if (zip->ppstream.avail_in <= 0) {
		/*
		 * Ppmd7_DecodeSymbol might require reading multiple bytes
		 * and we are on boundary;
		 * last resort to read using __archive_read_ahead.
		 */
		ssize_t bytes_avail = 0;
		const uint8_t* data = __archive_read_ahead(a,
		    zip->ppstream.stream_in+1, &bytes_avail);
		if(bytes_avail < zip->ppstream.stream_in+1) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7z file data");
			zip->ppstream.overconsumed = 1;
			return (0);
		}
		zip->ppstream.next_in++;
		b = data[zip->ppstream.stream_in];
	} else {
		b = *zip->ppstream.next_in++;
	}
	zip->ppstream.avail_in--;
	zip->ppstream.total_in++;
	zip->ppstream.stream_in++;
	return (b);
}